

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

void oprop_id(long oprop,obj *otmp,obj *ostack,obj *olaunch)

{
  obj *olaunch_local;
  obj *ostack_local;
  obj *otmp_local;
  long oprop_local;
  
  if ((otmp->oprops & oprop) == 0) {
    if ((((otmp->oclass == '\x02') || (otmp->oclass == '\r')) &&
        (-0x19 < objects[otmp->otyp].oc_subtyp)) &&
       (((objects[otmp->otyp].oc_subtyp < -0x15 && (olaunch != (obj *)0x0)) &&
        (((int)objects[otmp->otyp].oc_subtyp == -(int)objects[olaunch->otyp].oc_subtyp &&
         ((olaunch->oprops & oprop) != 0)))))) {
      olaunch->oprops_known = oprop | olaunch->oprops_known;
    }
  }
  else {
    otmp->oprops_known = oprop | otmp->oprops_known;
    if (ostack != (obj *)0x0) {
      ostack->oprops_known = oprop | ostack->oprops_known;
    }
  }
  return;
}

Assistant:

void oprop_id(long oprop, struct obj *otmp, struct obj *ostack, struct obj *olaunch)
{
	if ((otmp->oprops & oprop)) {
	    otmp->oprops_known |= oprop;
	    if (ostack)
		ostack->oprops_known |= oprop;
	} else if (ammo_and_launcher(otmp, olaunch) &&
		   (olaunch->oprops & oprop)) {
	    olaunch->oprops_known |= oprop;
	}
}